

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int nn_sws_send(nn_pipebase *self,nn_msg *msg)

{
  nn_msghdr *mhdr;
  nn_usock *self_00;
  size_t sVar1;
  long in_RDI;
  uint8_t rand_mask [4];
  nn_msghdr msghdr;
  nn_cmsghdr *cmsg;
  size_t hdr_len;
  size_t nn_msg_size;
  int mask_pos;
  nn_iovec iov [3];
  nn_sws *sws;
  nn_msg *in_stack_ffffffffffffff48;
  nn_msg *in_stack_ffffffffffffff50;
  nn_iovec *in_stack_ffffffffffffff58;
  nn_cmsghdr *in_stack_ffffffffffffff60;
  undefined4 local_8c;
  undefined8 local_88;
  undefined4 local_80;
  void *local_78;
  size_t local_70;
  nn_cmsghdr *local_68;
  long local_60;
  ulong local_58;
  int local_4c;
  undefined1 *local_48;
  long local_40;
  void *local_38;
  size_t local_30;
  void *local_28;
  size_t local_20;
  nn_msghdr *local_18;
  
  if (in_RDI == 0) {
    mhdr = (nn_msghdr *)0x0;
  }
  else {
    mhdr = (nn_msghdr *)(in_RDI + -0x1538);
  }
  local_18 = mhdr;
  if ((int)mhdr[2].msg_controllen == 4) {
    if (*(int *)&mhdr[0xbd].msg_iov != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->outstate == NN_SWS_OUTSTATE_IDLE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
              ,0x17d);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_term((nn_msg *)0x1715d9);
    nn_msg_mv(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    memset((void *)((long)&local_18[0xbd].msg_iov + 4),0,0xe);
    local_60 = 2;
    local_68 = (nn_cmsghdr *)0x0;
    local_88 = 0;
    local_80 = 0;
    local_70 = nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    if (local_70 != 0) {
      local_78 = nn_chunkref_data((nn_chunkref *)&local_18[0xbe].msg_controllen);
      local_68 = nn_cmsg_nxthdr_(mhdr,in_stack_ffffffffffffff60);
      while ((local_68 != (nn_cmsghdr *)0x0 &&
             ((local_68->cmsg_level != -4 || (local_68->cmsg_type != 1))))) {
        local_68 = nn_cmsg_nxthdr_(mhdr,in_stack_ffffffffffffff60);
      }
    }
    if (local_68 == (nn_cmsghdr *)0x0) {
      *(undefined1 *)((long)&local_18[0xbd].msg_iov + 4) =
           *(undefined1 *)((long)&local_18[2].msg_controllen + 4);
    }
    else {
      *(char *)((long)&local_18[0xbd].msg_iov + 4) = (char)local_68[1].cmsg_len;
    }
    *(byte *)((long)&local_18[0xbd].msg_iov + 4) =
         *(byte *)((long)&local_18[0xbd].msg_iov + 4) | 0x80;
    self_00 = (nn_usock *)nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    sVar1 = nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    local_58 = (long)&(self_00->fsm).fn + sVar1;
    if (local_58 < 0x7e) {
      *(byte *)((long)&local_18[0xbd].msg_iov + 5) =
           *(byte *)((long)&local_18[0xbd].msg_iov + 5) | (byte)local_58;
    }
    else if (local_58 < 0x10000) {
      *(byte *)((long)&local_18[0xbd].msg_iov + 5) =
           *(byte *)((long)&local_18[0xbd].msg_iov + 5) | 0x7e;
      nn_puts((uint8_t *)((long)&local_18[0xbd].msg_iov + local_60 + 4),(uint16_t)local_58);
      local_60 = local_60 + 2;
    }
    else {
      *(byte *)((long)&local_18[0xbd].msg_iov + 5) =
           *(byte *)((long)&local_18[0xbd].msg_iov + 5) | 0x7f;
      nn_putll((uint8_t *)((long)&local_18[0xbd].msg_iov + local_60 + 4),local_58);
      local_60 = local_60 + 8;
    }
    if (*(int *)&local_18[3].msg_iov == 1) {
      *(byte *)((long)&local_18[0xbd].msg_iov + 5) =
           *(byte *)((long)&local_18[0xbd].msg_iov + 5) | 0x80;
      nn_random_generate(self_00,(size_t)in_stack_ffffffffffffff58);
      *(undefined4 *)((long)&local_18[0xbd].msg_iov + local_60 + 4) = local_8c;
      local_60 = local_60 + 4;
      local_4c = 0;
      in_stack_ffffffffffffff50 =
           (nn_msg *)nn_chunkref_data((nn_chunkref *)&local_18[0xbd].msg_controllen);
      sVar1 = nn_chunkref_size((nn_chunkref *)in_stack_ffffffffffffff50);
      nn_sws_mask_payload((uint8_t *)in_stack_ffffffffffffff50,sVar1,(uint8_t *)&local_8c,4,
                          &local_4c);
      in_stack_ffffffffffffff58 =
           (nn_iovec *)nn_chunkref_data((nn_chunkref *)&local_18[0xbf].msg_controllen);
      sVar1 = nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
      nn_sws_mask_payload((uint8_t *)in_stack_ffffffffffffff58,sVar1,(uint8_t *)&local_8c,4,
                          &local_4c);
    }
    else {
      if (*(int *)&local_18[3].msg_iov != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
                ,0x1ce);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined1 *)((long)&local_18[0xbd].msg_iov + 5) =
           *(undefined1 *)((long)&local_18[0xbd].msg_iov + 5);
    }
    local_48 = (undefined1 *)((long)&local_18[0xbd].msg_iov + 4);
    local_40 = local_60;
    local_38 = nn_chunkref_data((nn_chunkref *)&local_18[0xbd].msg_controllen);
    local_30 = nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    local_28 = nn_chunkref_data((nn_chunkref *)&local_18[0xbf].msg_controllen);
    local_20 = nn_chunkref_size(&in_stack_ffffffffffffff50->sphdr);
    nn_usock_send(self_00,in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20))
    ;
    *(undefined4 *)&local_18[0xbd].msg_iov = 2;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)local_18[2].msg_controllen,
          "NN_SWS_STATE_ACTIVE",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
          ,0x17c);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sws_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_iovec iov [3];
    int mask_pos;
    size_t nn_msg_size;
    size_t hdr_len;
    struct nn_cmsghdr *cmsg;
    struct nn_msghdr msghdr;
    uint8_t rand_mask [NN_SWS_FRAME_SIZE_MASK];

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);
    nn_assert (sws->outstate == NN_SWS_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&sws->outmsg);
    nn_msg_mv (&sws->outmsg, msg);

    memset (sws->outhdr, 0, sizeof (sws->outhdr));

    hdr_len = NN_SWS_FRAME_SIZE_INITIAL;

    cmsg = NULL;
    msghdr.msg_iov = NULL;
    msghdr.msg_iovlen = 0;
    msghdr.msg_controllen = nn_chunkref_size (&sws->outmsg.hdrs);

    /*  If the outgoing message has specified an opcode and control framing in
        its header, properly frame it as per RFC 6455 5.2. */
    if (msghdr.msg_controllen > 0) {
        msghdr.msg_control = nn_chunkref_data (&sws->outmsg.hdrs);
        cmsg = NN_CMSG_FIRSTHDR (&msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == NN_WS && cmsg->cmsg_type == NN_WS_MSG_TYPE)
                break;
            cmsg = NN_CMSG_NXTHDR (&msghdr, cmsg);
        }
    }

    /*  If the header does not specify an opcode, take default from option. */
    if (cmsg)
        sws->outhdr [0] = *(uint8_t *) NN_CMSG_DATA (cmsg);
    else
        sws->outhdr [0] = sws->msg_type;

    /*  For now, enforce that outgoing messages are the final frame. */
    sws->outhdr [0] |= NN_SWS_FRAME_BITMASK_FIN;

    nn_msg_size = nn_chunkref_size (&sws->outmsg.sphdr) +
        nn_chunkref_size (&sws->outmsg.body);

    /*  Framing WebSocket payload size in network byte order (big endian). */
    if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH) {
        sws->outhdr [1] |= (uint8_t) nn_msg_size;
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
    }
    else if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH_16) {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_16;
        nn_puts (&sws->outhdr [hdr_len], (uint16_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
    }
    else {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_63;
        nn_putll (&sws->outhdr [hdr_len], (uint64_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
    }

    if (sws->mode == NN_WS_CLIENT) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_MASKED;

        /*  Generate 32-bit mask as per RFC 6455 5.3. */
        nn_random_generate (rand_mask, NN_SWS_FRAME_SIZE_MASK);

        memcpy (&sws->outhdr [hdr_len], rand_mask, NN_SWS_FRAME_SIZE_MASK);
        hdr_len += NN_SWS_FRAME_SIZE_MASK;

        /*  Mask payload, beginning with header and moving to body. */
        mask_pos = 0;

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.sphdr),
            nn_chunkref_size (&sws->outmsg.sphdr),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.body),
            nn_chunkref_size (&sws->outmsg.body),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

    }
    else if (sws->mode == NN_WS_SERVER) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_NOT_MASKED;
    }
    else {
        /*  Developer error; sws object was not constructed properly. */
        nn_assert (0);
    }

    /*  Start async sending. */
    iov [0].iov_base = sws->outhdr;
    iov [0].iov_len = hdr_len;
    iov [1].iov_base = nn_chunkref_data (&sws->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&sws->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&sws->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&sws->outmsg.body);
    nn_usock_send (sws->usock, iov, 3);

    sws->outstate = NN_SWS_OUTSTATE_SENDING;

    return 0;
}